

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

void __thiscall
ON_RTree::SplitNode(ON_RTree *this,ON_RTreeNode *a_node,ON_RTreeBranch *a_branch,
                   ON_RTreeNode **a_newNode)

{
  double dVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  double *pdVar5;
  ON_RTreeNode *a_nodeB;
  int iVar6;
  ON_RTreeBBox *pOVar7;
  ON_RTreeBBox *a_rectB;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double area [7];
  ON_RTreePartitionVars localVars;
  long local_390;
  ON_RTreeBBox local_328;
  ON_RTreeBBox local_2f8;
  ON_RTreePartitionVars local_2b8;
  
  iVar3 = a_node->m_level;
  memcpy(local_2b8.m_branchBuf,a_node->m_branch,0x150);
  local_2b8.m_branchBuf[6].m_rect.m_min[0] = (a_branch->m_rect).m_min[0];
  local_2b8.m_branchBuf[6].m_rect.m_min[1] = (a_branch->m_rect).m_min[1];
  local_2b8.m_branchBuf[6].m_rect.m_min[2] = (a_branch->m_rect).m_min[2];
  local_2b8.m_branchBuf[6].m_rect.m_max[0] = (a_branch->m_rect).m_max[0];
  local_2b8.m_branchBuf[6].m_rect.m_max[1] = (a_branch->m_rect).m_max[1];
  local_2b8.m_branchBuf[6].m_rect.m_max[2] = (a_branch->m_rect).m_max[2];
  local_2b8.m_branchBuf[6].field_1 = a_branch->field_1;
  local_2b8.m_branchCount = 7;
  local_2b8.m_coverSplit.m_min[0] = a_node->m_branch[0].m_rect.m_min[0];
  local_2b8.m_coverSplit.m_min[1] = a_node->m_branch[0].m_rect.m_min[1];
  local_2b8.m_coverSplit.m_min[2] = a_node->m_branch[0].m_rect.m_min[2];
  local_2b8.m_coverSplit.m_max[0] = a_node->m_branch[0].m_rect.m_max[0];
  local_2b8.m_coverSplit.m_max[1] = a_node->m_branch[0].m_rect.m_max[1];
  local_2b8.m_coverSplit.m_max[2] = a_node->m_branch[0].m_rect.m_max[2];
  lVar13 = 0xf0;
  do {
    CombineRectHelper(&local_2f8,&local_2b8.m_coverSplit,
                      (ON_RTreeBBox *)((long)local_2b8.m_partition + lVar13));
    local_2b8.m_coverSplit.m_max[1] = local_2f8.m_max[1];
    local_2b8.m_coverSplit.m_max[2] = local_2f8.m_max[2];
    local_2b8.m_coverSplit.m_min[2] = local_2f8.m_min[2];
    local_2b8.m_coverSplit.m_max[0] = local_2f8.m_max[0];
    local_2b8.m_coverSplit.m_min[0] = local_2f8.m_min[0];
    local_2b8.m_coverSplit.m_min[1] = local_2f8.m_min[1];
    lVar13 = lVar13 + 0x38;
  } while (lVar13 != 0x240);
  dVar26 = (local_2f8.m_max[2] - local_2f8.m_min[2]) * (local_2f8.m_max[2] - local_2f8.m_min[2]) +
           (local_2f8.m_max[1] - local_2f8.m_min[1]) * (local_2f8.m_max[1] - local_2f8.m_min[1]) +
           (local_2f8.m_max[0] - local_2f8.m_min[0]) * (local_2f8.m_max[0] - local_2f8.m_min[0]);
  local_2b8.m_coverSplitArea = dVar26;
  a_node->m_level = -1;
  a_node->m_count = 0;
  local_2b8.m_count[0] = 0;
  local_2b8.m_count[1] = 0;
  local_2b8.m_area[0] = 0.0;
  local_2b8.m_area[1] = 0.0;
  local_2b8.m_total = 7;
  local_2b8.m_minFill = 2;
  local_2b8.m_partition[0] = -1;
  local_2b8.m_partition[1] = -1;
  local_2b8.m_partition[2] = -1;
  local_2b8.m_partition[3] = -1;
  local_2b8.m_partition[4] = -1;
  local_2b8.m_partition[5] = -1;
  local_2b8.m_partition[6] = -1;
  lVar13 = 9;
  do {
    local_2b8.m_partition[lVar13] = 0;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x10);
  pdVar5 = local_2b8.m_branchBuf[0].m_rect.m_max + 2;
  lVar13 = 0;
  do {
    dVar25 = pdVar5[-2] - ((ON_RTreeBBox *)(pdVar5 + -5))->m_min[0];
    local_2f8.m_min[lVar13] =
         (*pdVar5 - pdVar5[-3]) * (*pdVar5 - pdVar5[-3]) +
         (pdVar5[-1] - pdVar5[-4]) * (pdVar5[-1] - pdVar5[-4]) + dVar25 * dVar25;
    lVar13 = lVar13 + 1;
    pdVar5 = pdVar5 + 7;
  } while (lVar13 != 7);
  dVar26 = -1.0 - dVar26;
  uVar8 = 1;
  local_390 = 0;
  uVar11 = 1;
  pOVar7 = &local_2b8.m_branchBuf[1].m_rect;
  iVar6 = 0;
  do {
    dVar25 = local_2f8.m_min[local_390];
    a_rectB = pOVar7;
    uVar12 = uVar11;
    do {
      CombineRectHelper(&local_328,&local_2b8.m_branchBuf[local_390].m_rect,a_rectB);
      dVar28 = (((local_328.m_max[2] - local_328.m_min[2]) *
                 (local_328.m_max[2] - local_328.m_min[2]) +
                (local_328.m_max[1] - local_328.m_min[1]) *
                (local_328.m_max[1] - local_328.m_min[1]) +
                (local_328.m_max[0] - local_328.m_min[0]) *
                (local_328.m_max[0] - local_328.m_min[0])) - dVar25) - local_2f8.m_min[uVar12];
      if (dVar26 < dVar28) {
        uVar8 = uVar12 & 0xffffffff;
      }
      iVar10 = (int)local_390;
      if (dVar28 <= dVar26) {
        dVar28 = dVar26;
        iVar10 = iVar6;
      }
      iVar6 = iVar10;
      dVar26 = dVar28;
      uVar12 = uVar12 + 1;
      a_rectB = (ON_RTreeBBox *)(a_rectB[1].m_min + 1);
    } while (uVar12 != 7);
    local_390 = local_390 + 1;
    uVar11 = uVar11 + 1;
    pOVar7 = (ON_RTreeBBox *)(pOVar7[1].m_min + 1);
  } while (local_390 != 6);
  ClassifyHelper(iVar6,0,&local_2b8);
  ClassifyHelper((int)uVar8,1,&local_2b8);
  if (local_2b8.m_count[1] + local_2b8.m_count[0] < local_2b8.m_total) {
    iVar6 = local_2b8.m_total - local_2b8.m_minFill;
    bVar4 = true;
    if (local_2b8.m_count[1] < iVar6 && local_2b8.m_count[0] < iVar6) {
      do {
        if (local_2b8.m_total < 1) {
          iVar6 = 0;
          iVar10 = 0;
        }
        else {
          uVar11 = 0;
          uVar14 = 0;
          uVar15 = 0xbff00000;
          uVar12 = 0;
          pdVar5 = local_2b8.m_branchBuf[0].m_rect.m_max + 2;
          uVar8 = 0;
          do {
            if (local_2b8.m_taken[uVar11] == 0) {
              dVar26 = ((ON_RTreeBBox *)(pdVar5 + -5))->m_min[0];
              dVar25 = pdVar5[-4];
              dVar28 = pdVar5[-3];
              dVar27 = pdVar5[-2];
              dVar1 = pdVar5[-1];
              dVar2 = *pdVar5;
              dVar18 = local_2b8.m_cover[0].m_min[0];
              if (dVar26 <= local_2b8.m_cover[0].m_min[0]) {
                dVar18 = dVar26;
              }
              dVar20 = local_2b8.m_cover[0].m_min[1];
              if (dVar25 <= local_2b8.m_cover[0].m_min[1]) {
                dVar20 = dVar25;
              }
              dVar22 = local_2b8.m_cover[0].m_min[2];
              if (dVar28 <= local_2b8.m_cover[0].m_min[2]) {
                dVar22 = dVar28;
              }
              dVar24 = local_2b8.m_cover[0].m_max[0];
              if (local_2b8.m_cover[0].m_max[0] <= dVar27) {
                dVar24 = dVar27;
              }
              dVar19 = local_2b8.m_cover[0].m_max[1];
              if (local_2b8.m_cover[0].m_max[1] <= dVar1) {
                dVar19 = dVar1;
              }
              dVar21 = local_2b8.m_cover[0].m_max[2];
              if (local_2b8.m_cover[0].m_max[2] <= dVar2) {
                dVar21 = dVar2;
              }
              dVar23 = local_2b8.m_cover[1].m_min[0];
              if (dVar26 <= local_2b8.m_cover[1].m_min[0]) {
                dVar23 = dVar26;
              }
              dVar26 = local_2b8.m_cover[1].m_min[1];
              if (dVar25 <= local_2b8.m_cover[1].m_min[1]) {
                dVar26 = dVar25;
              }
              uVar16 = SUB84(local_2b8.m_cover[1].m_min[2],0);
              uVar17 = (undefined4)((ulong)local_2b8.m_cover[1].m_min[2] >> 0x20);
              if (dVar28 <= local_2b8.m_cover[1].m_min[2]) {
                uVar16 = SUB84(dVar28,0);
                uVar17 = (undefined4)((ulong)dVar28 >> 0x20);
              }
              dVar25 = local_2b8.m_cover[1].m_max[0];
              if (local_2b8.m_cover[1].m_max[0] <= dVar27) {
                dVar25 = dVar27;
              }
              dVar28 = local_2b8.m_cover[1].m_max[1];
              if (local_2b8.m_cover[1].m_max[1] <= dVar1) {
                dVar28 = dVar1;
              }
              dVar27 = local_2b8.m_cover[1].m_max[2];
              if (local_2b8.m_cover[1].m_max[2] <= dVar2) {
                dVar27 = dVar2;
              }
              dVar27 = dVar27 - (double)CONCAT44(uVar17,uVar16);
              dVar28 = ((dVar27 * dVar27 +
                        (dVar28 - dVar26) * (dVar28 - dVar26) +
                        (dVar25 - dVar23) * (dVar25 - dVar23)) - local_2b8.m_area[1]) +
                       (local_2b8.m_area[0] -
                       ((dVar21 - dVar22) * (dVar21 - dVar22) +
                       (dVar19 - dVar20) * (dVar19 - dVar20) + (dVar24 - dVar18) * (dVar24 - dVar18)
                       ));
              dVar25 = -dVar28;
              dVar26 = dVar25;
              if (dVar28 >= dVar25) {
                dVar26 = dVar28;
              }
              uVar9 = (ulong)(dVar28 < dVar25);
              bVar4 = dVar26 == (double)CONCAT44(uVar15,uVar14);
              if (dVar26 < (double)CONCAT44(uVar15,uVar14) || bVar4) {
                if (((bVar4) && (!NAN(dVar26) && !NAN((double)CONCAT44(uVar15,uVar14)))) &&
                   (local_2b8.m_count[dVar28 < 0.0] < local_2b8.m_count[uVar8])) {
                  uVar12 = uVar11 & 0xffffffff;
                  uVar8 = uVar9;
                }
                goto LAB_005b3059;
              }
              uVar12 = uVar11 & 0xffffffff;
            }
            else {
LAB_005b3059:
              dVar26 = (double)CONCAT44(uVar15,uVar14);
              uVar9 = uVar8;
            }
            iVar6 = (int)uVar9;
            iVar10 = (int)uVar12;
            uVar11 = uVar11 + 1;
            pdVar5 = pdVar5 + 7;
            uVar14 = SUB84(dVar26,0);
            uVar15 = (undefined4)((ulong)dVar26 >> 0x20);
            uVar8 = uVar9;
          } while ((uint)local_2b8.m_total != uVar11);
        }
        ClassifyHelper(iVar10,iVar6,&local_2b8);
        bVar4 = local_2b8.m_count[1] + local_2b8.m_count[0] < local_2b8.m_total;
        if (local_2b8.m_total <= local_2b8.m_count[1] + local_2b8.m_count[0]) goto LAB_005b3268;
        iVar6 = local_2b8.m_total - local_2b8.m_minFill;
      } while ((local_2b8.m_count[0] < iVar6) && (local_2b8.m_count[1] < iVar6));
    }
    if (bVar4) {
      bVar4 = iVar6 <= local_2b8.m_count[0];
      if (0 < local_2b8.m_total) {
        lVar13 = 0;
        do {
          if (local_2b8.m_taken[lVar13] == 0) {
            ClassifyHelper((int)lVar13,(uint)bVar4,&local_2b8);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < local_2b8.m_total);
      }
    }
  }
LAB_005b3268:
  a_nodeB = ON_RTreeMemPool::AllocNode(&this->m_mem_pool);
  *a_newNode = a_nodeB;
  a_node->m_level = iVar3;
  a_nodeB->m_level = iVar3;
  LoadNodes(this,a_node,a_nodeB,&local_2b8);
  return;
}

Assistant:

void ON_RTree::SplitNode(ON_RTreeNode* a_node, ON_RTreeBranch* a_branch, ON_RTreeNode** a_newNode)
{
  ON_RTreePartitionVars localVars;
  int level;

  // Load all the branches into a buffer, initialize a_node to be empty
  level = a_node->m_level; // save m_level (The InitNode() call in GetBranches will set it to -1)
  GetBranches(a_node, a_branch, &localVars);

  // Find partition
  ChoosePartition(&localVars, ON_RTree_MIN_NODE_COUNT);

  // Put branches from buffer into 2 nodes according to chosen partition
  *a_newNode = m_mem_pool.AllocNode();
  (*a_newNode)->m_level = a_node->m_level = level; // restore m_level
  LoadNodes(a_node, *a_newNode, &localVars);
}